

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O1

void __thiscall ki::dml::Record::from_xml(Record *this,xml_node<char> *node)

{
  FieldNameMap *this_00;
  FieldBase *pFVar1;
  int iVar2;
  FieldBase *this_01;
  const_iterator cVar3;
  mapped_type *ppFVar4;
  __normal_iterator<ki::dml::FieldBase_**,_std::vector<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>_>
  _Var5;
  ostream *poVar6;
  value_error *this_02;
  char *pcVar7;
  xml_node<char> *node_00;
  FieldBase *old_field;
  string node_name;
  ostringstream oss;
  FieldBase *local_218;
  _Base_ptr local_210;
  string local_208;
  string local_1e8;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  string local_1a8 [11];
  
  pcVar7 = (node->super_xml_base<char>).m_name;
  if (pcVar7 == (char *)0x0) {
    pcVar7 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  std::__cxx11::string::string((string *)local_1c8,pcVar7,(allocator *)local_1a8);
  iVar2 = std::__cxx11::string::compare((char *)local_1c8);
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Expected <RECORD> node but got <",0x20);
    pcVar7 = (node->super_xml_base<char>).m_name;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = &rapidxml::xml_base<char>::nullstr()::zero;
    }
    poVar6 = std::operator<<((ostream *)local_1a8,pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,">.",2);
    this_02 = (value_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    value_error::value_error(this_02,&local_1e8);
    __cxa_throw(this_02,&value_error::typeinfo,std::runtime_error::~runtime_error);
  }
  node_00 = node->m_first_node;
  if (node_00 != (xml_node<char> *)0x0) {
    this_00 = &this->m_field_map;
    local_210 = &(this->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      if (node_00->m_type == node_element) {
        this_01 = FieldBase::create_from_xml(node_00);
        FieldBase::get_name_abi_cxx11_(&local_208,this_01);
        cVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
                ::find(&this_00->_M_t,&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        if (cVar3._M_node == local_210) {
          add_field(this,this_01);
        }
        else {
          FieldBase::get_name_abi_cxx11_(local_1a8,this_01);
          ppFVar4 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
                    ::at(this_00,local_1a8);
          pFVar1 = *ppFVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p);
          }
          local_218 = pFVar1;
          if (this_01->m_type_hash == pFVar1->m_type_hash) {
            (*(pFVar1->super_Serializable)._vptr_Serializable[0xb])(pFVar1,this_01);
          }
          else {
            _Var5 = std::
                    __find_if<__gnu_cxx::__normal_iterator<ki::dml::FieldBase**,std::vector<ki::dml::FieldBase*,std::allocator<ki::dml::FieldBase*>>>,__gnu_cxx::__ops::_Iter_equals_val<ki::dml::FieldBase*const>>
                              ((this->m_fields).
                               super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               (this->m_fields).
                               super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish,&local_218);
            *_Var5._M_current = this_01;
            FieldBase::get_name_abi_cxx11_(local_1a8,this_01);
            ppFVar4 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
                      ::operator[](this_00,local_1a8);
            *ppFVar4 = this_01;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
              operator_delete(local_1a8[0]._M_dataplus._M_p);
            }
            this_01 = local_218;
            if (local_218 == (FieldBase *)0x0) goto LAB_0013fbd9;
          }
          (*(this_01->super_Serializable)._vptr_Serializable[4])(this_01);
        }
      }
LAB_0013fbd9:
      if ((node_00->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
        __assert_fail("this->m_parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Joshsora[P]kipy/dependencies/libki/third_party/rapidxml.hpp"
                      ,0x3ee,
                      "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                     );
      }
      node_00 = node_00->m_next_sibling;
    } while (node_00 != (xml_node<char> *)0x0);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0]);
  }
  return;
}

Assistant:

void Record::from_xml(rapidxml::xml_node<> *node)
	{
		// Make sure that we've been passed a <RECORD> element.
		const std::string node_name = node->name();
		if (node_name != "RECORD")
		{
			std::ostringstream oss;
			oss << "Expected <RECORD> node but got <" << node->name() << ">.";
			throw value_error(oss.str());
		}

		// Every child node inside a <RECORD> element is a Field.
		for (auto *field_node = node->first_node();
			field_node; field_node = field_node->next_sibling())
		{
			if (field_node->type() != rapidxml::node_type::node_element)
				continue;

			FieldBase *field = FieldBase::create_from_xml(field_node);
			if (has_field(field->get_name()))
			{
				// Is the old field the same type as the one created from
				// the XML data?
				FieldBase *old_field = m_field_map.at(field->get_name());
				if (field->m_type_hash == old_field->m_type_hash)
				{
					// Set the value of the old field to the value of the new
					// one.
					old_field->set_value(field);
					delete field;
				}
				else
				{
					// Since the types are different, we can't set the value
					// of the old field to the value of the new one so,
					// replace the old field with this new one instead.
					const std::ptrdiff_t index = std::find(
						m_fields.begin(), m_fields.end(), old_field) - m_fields.begin();
					m_fields[index] = field;
					m_field_map[field->get_name()] = field;
					delete old_field;
				}
			}
			else
				add_field(field);
		}
	}